

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tria_o2.cc
# Opt level: O0

MatrixXd * __thiscall
lf::geometry::TriaO2::Jacobian(MatrixXd *__return_storage_ptr__,TriaO2 *this,MatrixXd *local)

{
  long lVar1;
  bool bVar2;
  runtime_error *this_00;
  Index IVar3;
  Index cols;
  bool local_5b1;
  NestedExpressionType local_5b0;
  Replicate<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1> local_5a8;
  ArrayWrapper<const_Eigen::Replicate<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1>_> local_590;
  ConstColwiseReturnType local_578;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Replicate<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1>_>
  local_560;
  MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Replicate<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1>_>_>
  local_528;
  Replicate<Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,__1> local_4f0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Replicate<Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_4d8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Replicate<Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Replicate<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1>_>_>_>
  local_4b0;
  VectorwiseOp<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> local_440;
  Nested local_438;
  undefined1 local_430 [8];
  MatrixXd local_reversed;
  ConstColXpr local_3e0;
  ConstTransposeReturnType local_3a8;
  ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
  local_370;
  NestedExpressionType local_338;
  ExpressionTypeNested local_330;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>,__1,_1>_>
  local_328;
  long local_2d0;
  long i;
  Index local_2c0;
  undefined1 local_2b8 [8];
  MatrixXd tmp;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  stringstream local_220 [8];
  stringstream ss;
  ostream local_210 [376];
  Scalar local_98;
  NestedExpressionType local_90;
  CmpLEReturnType local_88;
  NestedExpressionType local_60;
  Scalar local_58;
  RCmpLEReturnType local_50;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_20;
  MatrixXd *local_local;
  TriaO2 *this_local;
  
  local_58 = 0.0;
  local_20 = (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local;
  local_local = (MatrixXd *)this;
  this_local = (TriaO2 *)__return_storage_ptr__;
  local_60 = (NestedExpressionType)
             Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::array
                       ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local);
  Eigen::operator<=(&local_50,&local_58,
                    (ArrayBase<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     *)&local_60);
  bVar2 = Eigen::
          DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
          ::all((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                 *)&local_50);
  local_5b1 = false;
  if (bVar2) {
    local_90 = (NestedExpressionType)
               Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::array(local_20);
    local_98 = 1.0;
    Eigen::ArrayBase<Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>::
    operator<=(&local_88,
               (ArrayBase<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
               &local_90,&local_98);
    local_5b1 = Eigen::
                DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>_>_>
                ::all((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>_>_>
                       *)&local_88);
  }
  if (((local_5b1 ^ 0xffU) & 1) != 0) {
    std::__cxx11::stringstream::stringstream(local_220);
    std::operator<<(local_210,"local coordinates out of bounds for reference element");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_250,"(0. <= local.array()).all() && (local.array() <= 1.).all()",
               &local_251);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o2.cc"
               ,&local_279);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed
              (&local_250,&local_278,0x42,
               (string *)
               &tmp.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                m_cols);
    std::__cxx11::string::~string
              ((string *)
               &tmp.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                m_cols);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator(&local_279);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator(&local_251);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"this code should not be reached");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_2c0 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::rows
                        (&(this->gamma_).
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>);
  IVar3 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_20);
  i = IVar3 << 1;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<long,long>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_2b8,&local_2c0,&i);
  for (local_2d0 = 0; lVar1 = local_2d0,
      IVar3 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                        ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_20),
      lVar1 < IVar3; local_2d0 = local_2d0 + 1) {
    local_338 = (NestedExpressionType)
                Eigen::MatrixBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::array
                          ((MatrixBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)&this->gamma_x_2_)
    ;
    local_330.m_expression =
         (NestedExpressionType)
         Eigen::DenseBase<Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>_>::
         rowwise((DenseBase<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>_>_> *)
                 &local_338);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (&local_3e0,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_20,local_2d0
              );
    Eigen::DenseBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::
    transpose(&local_3a8,
              (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
               *)&local_3e0);
    Eigen::
    MatrixBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>_>
    ::array(&local_370,
            (MatrixBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
             *)&local_3a8);
    Eigen::VectorwiseOp<Eigen::ArrayWrapper<Eigen::Matrix<double,-1,2,0,-1,2>const>const,1>::
    operator*(&local_328,
              (VectorwiseOp<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,2,0,_1,2>const>const,1> *)
              &local_330,
              (DenseBase<Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>_>
               *)&local_370);
    lVar1 = local_2d0 * 2;
    IVar3 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                      ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_2b8);
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<long,int>
              ((Type *)&local_reversed.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_cols,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_2b8,0,lVar1,
               IVar3,2);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false> *)
               &local_reversed.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>,__1,_1>_>_>
                *)&local_328);
  }
  local_440.m_matrix =
       (ExpressionTypeNested)
       Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::colwise
                 ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_20);
  local_438 = (Nested)Eigen::VectorwiseOp<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                      reverse(&local_440);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Reverse<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_430,
             (EigenBase<Eigen::Reverse<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_> *)
             &local_438);
  cols = Eigen::EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::size
                   ((EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_20);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_430,1,cols);
  IVar3 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_20);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::replicate
            (&local_4f0,(DenseBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)&this->beta_,1,IVar3);
  Eigen::MatrixBase<Eigen::Replicate<Eigen::Matrix<double,-1,2,0,-1,2>,-1,-1>>::operator+
            (&local_4d8,
             (MatrixBase<Eigen::Replicate<Eigen::Matrix<double,_1,2,0,_1,2>,_1,_1>> *)&local_4f0,
             (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_2b8);
  IVar3 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
                    (&(this->delta_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
  ;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::replicate
            (&local_5a8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_430,IVar3,1);
  Eigen::MatrixBase<Eigen::Replicate<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1>_>::array
            (&local_590,
             (MatrixBase<Eigen::Replicate<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1>_> *)
             &local_5a8);
  Eigen::
  DenseBase<Eigen::ArrayWrapper<const_Eigen::Replicate<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1>_>_>
  ::colwise(&local_578,
            (DenseBase<Eigen::ArrayWrapper<const_Eigen::Replicate<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1>_>_>
             *)&local_590);
  local_5b0 = (NestedExpressionType)
              Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::array
                        ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->delta_);
  Eigen::
  VectorwiseOp<Eigen::ArrayWrapper<Eigen::Replicate<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1>const>const,0>
  ::operator*(&local_560,
              (VectorwiseOp<Eigen::ArrayWrapper<Eigen::Replicate<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1>const>const,0>
               *)&local_578,
              (DenseBase<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
              &local_5b0);
  Eigen::
  ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Replicate<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_1,_-1>_>_>
  ::matrix(&local_528,
           (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Replicate<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1>_>_>
            *)&local_560);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Replicate<Eigen::Matrix<double,-1,2,0,-1,2>,-1,-1>const,Eigen::Matrix<double,-1,-1,0,-1,-1>const>>
  ::operator+(&local_4b0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Replicate<Eigen::Matrix<double,_1,2,0,_1,2>,_1,_1>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
               *)&local_4d8,
              (MatrixBase<Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Replicate<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1>_>_>_>
               *)&local_528);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Replicate<Eigen::Matrix<double,_1,2,0,_1,2>,_1,_1>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Replicate<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1>const>const,Eigen::Replicate<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>const>,1,_1>const>>const>>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Replicate<Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Replicate<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1>_>_>_>_>
              *)&local_4b0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_430);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_2b8);
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd TriaO2::Jacobian(const Eigen::MatrixXd& local) const {
  LF_VERIFY_MSG((0. <= local.array()).all() && (local.array() <= 1.).all(),
                "local coordinates out of bounds for reference element");

  Eigen::MatrixXd tmp(gamma_.rows(), 2 * local.cols());

  for (long i = 0; i < local.cols(); ++i) {
    tmp.block(0, 2 * i, tmp.rows(), 2) =
        gamma_x_2_.array().rowwise() * local.col(i).transpose().array();
  }

  Eigen::MatrixXd local_reversed = local.colwise().reverse();
  local_reversed.resize(1, local.size());

  return beta_.replicate(1, local.cols()) + tmp +
         (local_reversed.replicate(delta_.rows(), 1).array().colwise() *
          delta_.array())
             .matrix();
}